

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  undefined4 uVar1;
  cmCustomCommandGenerator *commands_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TargetType targetType;
  char *pcVar5;
  string *psVar6;
  ulong uVar7;
  undefined4 extraout_var;
  long lVar8;
  const_reference pvVar9;
  pointer this_00;
  long lVar10;
  string_view sVar11;
  cmAlphaNum local_678;
  cmAlphaNum local_648;
  string local_618;
  cmAlphaNum local_5f8;
  cmAlphaNum local_5c8;
  string local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  cmAlphaNum local_558;
  string local_528;
  cmAlphaNum local_508;
  string local_4d8;
  ulong local_4b8;
  size_type rcurly;
  size_type lcurly;
  string_view local_488;
  string local_478;
  undefined1 local_458 [8];
  string shellCommand;
  string local_428;
  string local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  string output;
  RuleVariables vars;
  allocator<char> local_261;
  string local_260;
  cmValue local_240;
  cmValue val;
  string launcher;
  cmAlphaNum local_1e8;
  string local_1b8;
  undefined1 local_191;
  undefined1 local_190 [7];
  bool has_slash;
  byte local_169;
  undefined1 local_168 [7];
  bool had_slash;
  string local_148;
  undefined1 local_128 [8];
  string suffix;
  undefined1 local_100 [7];
  bool useCall;
  string cmd;
  undefined1 local_d8 [4];
  uint c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string workingDir;
  string dir;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *comment;
  string *psStack_30;
  bool echo_comment_local;
  string *relative_local;
  cmGeneratorTarget *target_local;
  cmCustomCommandGenerator *ccg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  comment._7_1_ = echo_comment;
  psStack_30 = relative;
  relative_local = (string *)target;
  target_local = (cmGeneratorTarget *)ccg;
  ccg_local = (cmCustomCommandGenerator *)commands;
  commands_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  if (((echo_comment) &&
      (pcVar5 = cmCustomCommandGenerator::GetComment(ccg), commands_00 = ccg_local,
      local_40 = pcVar5, pcVar5 != (char *)0x0)) && (*pcVar5 != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar5,&local_61);
    AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)commands_00,&local_60,EchoGenerate,(EchoProgress *)0x0);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)(workingDir.field_2._M_local_buf + 8),(string *)psVar6);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
            ((string *)&rulePlaceholderExpander,(cmCustomCommandGenerator *)target_local);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)(workingDir.field_2._M_local_buf + 8),(string *)&rulePlaceholderExpander);
  }
  if (content != (ostream *)0x0) {
    std::operator<<(content,(string *)(workingDir.field_2._M_local_buf + 8));
  }
  iVar3 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])()
  ;
  std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
  unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
            ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>> *
             )&commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (pointer)CONCAT44(extraout_var,iVar3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8);
  cmd.field_2._12_4_ = 0;
  do {
    uVar1 = cmd.field_2._12_4_;
    uVar4 = cmCustomCommandGenerator::GetNumberOfCommands((cmCustomCommandGenerator *)target_local);
    if (uVar4 <= (uint)uVar1) {
      CreateCDCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_d8,(string *)((long)&workingDir.field_2 + 8),psStack_30);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ccg_local,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
      std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
      ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   *)&commands1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
      std::__cxx11::string::~string((string *)(workingDir.field_2._M_local_buf + 8));
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_
              ((string *)local_100,(cmCustomCommandGenerator *)target_local,cmd.field_2._12_4_);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      suffix.field_2._M_local_buf[0xf] = '\0';
      bVar2 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar2) {
        std::__cxx11::string::string((string *)local_128);
        uVar7 = std::__cxx11::string::size();
        if (4 < uVar7) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_168,(ulong)local_100);
          cmsys::SystemTools::LowerCase(&local_148,(string *)local_168);
          std::__cxx11::string::operator=((string *)local_128,(string *)&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)local_168);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_128,".bat");
          if (!bVar2) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_128,".cmd");
            if (!bVar2) goto LAB_008b2b31;
          }
          suffix.field_2._M_local_buf[0xf] = '\x01';
        }
LAB_008b2b31:
        std::__cxx11::string::~string((string *)local_128);
      }
      cmsys::SystemTools::ReplaceString((string *)local_100,"/./","/");
      lVar8 = std::__cxx11::string::find('\0',0x2f);
      local_169 = lVar8 != -1;
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)local_190,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)local_100);
        std::__cxx11::string::operator=((string *)local_100,(string *)local_190);
        std::__cxx11::string::~string((string *)local_190);
      }
      lVar8 = std::__cxx11::string::find('\0',0x2f);
      local_191 = lVar8 != -1;
      if (((local_169 & 1) != 0) && (!(bool)local_191)) {
        cmAlphaNum::cmAlphaNum(&local_1e8,"./");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&launcher.field_2 + 8),(string *)local_100);
        cmStrCat<>(&local_1b8,&local_1e8,(cmAlphaNum *)((long)&launcher.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_100,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      std::__cxx11::string::string((string *)&val);
      psVar6 = relative_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"RULE_LAUNCH_CUSTOM",&local_261);
      local_240 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)this,psVar6,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
      bVar2 = cmNonempty(local_240);
      if (bVar2) {
        cmRulePlaceholderExpander::RuleVariables::RuleVariables
                  ((RuleVariables *)((long)&output.field_2 + 8));
        cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)relative_local);
        output.field_2._8_8_ = std::__cxx11::string::c_str();
        targetType = cmGeneratorTarget::GetType((cmGeneratorTarget *)relative_local);
        cmState::GetTargetTypeName_abi_cxx11_(targetType);
        std::__cxx11::string::c_str();
        std::__cxx11::string::string((string *)&outputs);
        local_3e8 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                              ((cmCustomCommandGenerator *)target_local);
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(local_3e8);
        if (!bVar2) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_3e8,0);
          std::__cxx11::string::operator=((string *)&outputs,(string *)pvVar9);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) != 0) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      (&local_408,
                       &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,(string *)&outputs);
            std::__cxx11::string::operator=((string *)&outputs,(string *)&local_408);
            std::__cxx11::string::~string((string *)&local_408);
          }
          sVar11 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&outputs);
          shellCommand.field_2._8_8_ = sVar11._M_len;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_428,
                     &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,sVar11,SHELL);
          std::__cxx11::string::operator=((string *)&outputs,(string *)&local_428);
          std::__cxx11::string::~string((string *)&local_428);
        }
        std::__cxx11::string::c_str();
        psVar6 = cmValue::operator*[abi_cxx11_(&local_240);
        std::__cxx11::string::operator=((string *)&val,(string *)psVar6);
        this_00 = std::
                  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                  ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                *)&commands1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (this_00,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            super_cmOutputConverter,(string *)&val,
                   (RuleVariables *)((long)&output.field_2 + 8));
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&val," ");
        }
        std::__cxx11::string::~string((string *)&outputs);
      }
      MaybeConvertWatcomShellCommand((string *)local_458,this,(string *)local_100);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        sVar11 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
        local_488 = sVar11;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_478,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,sVar11,SHELL);
        std::__cxx11::string::operator=((string *)local_458,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcurly,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458)
      ;
      std::__cxx11::string::operator=((string *)local_100,(string *)&lcurly);
      std::__cxx11::string::~string((string *)&lcurly);
      cmCustomCommandGenerator::AppendArguments
                ((cmCustomCommandGenerator *)target_local,cmd.field_2._12_4_,(string *)local_100);
      if (content != (ostream *)0x0) {
        lVar8 = std::__cxx11::string::c_str();
        lVar10 = std::__cxx11::string::size();
        std::operator<<(content,(char *)(lVar8 + lVar10));
      }
      if ((this->BorlandMakeCurlyHack & 1U) != 0) {
        uVar7 = std::__cxx11::string::find('\0',0x7b);
        rcurly = uVar7;
        if (uVar7 != 0xffffffffffffffff) {
          lVar8 = std::__cxx11::string::size();
          if (uVar7 < lVar8 - 1U) {
            local_4b8 = std::__cxx11::string::find('\0',0x7d);
            if ((local_4b8 == 0xffffffffffffffff) || (rcurly < local_4b8)) {
              std::__cxx11::string::substr((ulong)&local_528,(ulong)local_100);
              cmAlphaNum::cmAlphaNum(&local_508,&local_528);
              cmAlphaNum::cmAlphaNum(&local_558,"{{}");
              std::__cxx11::string::substr((ulong)&local_578,(ulong)local_100);
              cmStrCat<std::__cxx11::string>(&local_4d8,&local_508,&local_558,&local_578);
              std::__cxx11::string::operator=((string *)local_100,(string *)&local_4d8);
              std::__cxx11::string::~string((string *)&local_4d8);
              std::__cxx11::string::~string((string *)&local_578);
              std::__cxx11::string::~string((string *)&local_528);
            }
          }
        }
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        if ((suffix.field_2._M_local_buf[0xf] & 1U) == 0) {
          bVar2 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if (bVar2) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_100);
            if (*pcVar5 == '\"') {
              cmAlphaNum::cmAlphaNum(&local_648,"echo >nul && ");
              cmAlphaNum::cmAlphaNum(&local_678,(string *)local_100);
              cmStrCat<>(&local_618,&local_648,&local_678);
              std::__cxx11::string::operator=((string *)local_100,(string *)&local_618);
              std::__cxx11::string::~string((string *)&local_618);
            }
          }
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_5c8,"call ");
          cmAlphaNum::cmAlphaNum(&local_5f8,(string *)local_100);
          cmStrCat<>(&local_598,&local_5c8,&local_5f8);
          std::__cxx11::string::operator=((string *)local_100,(string *)&local_598);
          std::__cxx11::string::~string((string *)&local_598);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8,(value_type *)local_100);
      std::__cxx11::string::~string((string *)local_458);
      std::__cxx11::string::~string((string *)&val);
    }
    std::__cxx11::string::~string((string *)local_100);
    cmd.field_2._12_4_ = cmd.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    const char* comment = ccg.GetComment();
    if (comment && *comment) {
      this->AppendEcho(commands, comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      cmValue val = this->GetRuleLauncher(target, "RULE_LAUNCH_CUSTOM");
      if (cmNonempty(val)) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType =
          cmState::GetTargetTypeName(target->GetType()).c_str();
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeRelativeToCurBinDir(output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = *val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            cmd =
              cmStrCat(cmd.substr(0, lcurly), "{{}", cmd.substr(lcurly + 1));
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = cmStrCat("call ", cmd);
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = cmStrCat("echo >nul && ", cmd);
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  // push back the custom commands
  cm::append(commands, commands1);
}